

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_matcher.cpp
# Opt level: O3

idx_t duckdb::TemplatedMatch<false,duckdb::string_t,duckdb::LessThan>
                (Vector *param_1,TupleDataVectorFormat *lhs_format,SelectionVector *sel,idx_t count,
                TupleDataLayout *rhs_layout,Vector *rhs_row_locations,idx_t col_idx,
                vector<duckdb::MatchFunction,_true> *param_8,SelectionVector *no_match_sel,
                idx_t *no_match_count)

{
  undefined8 *puVar1;
  data_ptr_t pdVar2;
  SelectionVector *pSVar3;
  data_ptr_t pdVar4;
  value_type vVar5;
  sel_t *psVar6;
  unsigned_long *puVar7;
  const_reference pvVar8;
  idx_t iVar9;
  idx_t iVar10;
  idx_t iVar11;
  bool bVar12;
  SelectionVector *lhs_sel;
  idx_t local_70;
  anon_union_16_2_67f50693_for_value local_40;
  
  if ((lhs_format->unified).validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
      (unsigned_long *)0x0) {
    pSVar3 = (lhs_format->unified).sel;
    pdVar2 = (lhs_format->unified).data;
    pdVar4 = rhs_row_locations->data;
    pvVar8 = vector<unsigned_long,_true>::operator[](&rhs_layout->offsets,col_idx);
    if (count != 0) {
      vVar5 = *pvVar8;
      local_70 = 0;
      iVar11 = 0;
      do {
        iVar9 = iVar11;
        if (sel->sel_vector != (sel_t *)0x0) {
          iVar9 = (idx_t)sel->sel_vector[iVar11];
        }
        psVar6 = pSVar3->sel_vector;
        iVar10 = iVar9;
        if (psVar6 != (sel_t *)0x0) {
          iVar10 = (idx_t)psVar6[iVar9];
        }
        puVar1 = (undefined8 *)(*(long *)(pdVar4 + iVar9 * 8) + vVar5);
        local_40._0_8_ = *puVar1;
        local_40.pointer.ptr = (char *)puVar1[1];
        if (((1 << ((byte)col_idx & 7) &
             (uint)*(byte *)(*(long *)(pdVar4 + iVar9 * 8) + (col_idx >> 3))) != 0) &&
           (bVar12 = string_t::StringComparisonOperators::GreaterThan
                               ((string_t *)&local_40.pointer,(string_t *)(pdVar2 + iVar10 * 0x10)),
           bVar12)) {
          sel->sel_vector[local_70] = (sel_t)iVar9;
          local_70 = local_70 + 1;
        }
        iVar11 = iVar11 + 1;
      } while (count != iVar11);
      return local_70;
    }
  }
  else {
    pdVar2 = rhs_row_locations->data;
    pSVar3 = (lhs_format->unified).sel;
    pdVar4 = (lhs_format->unified).data;
    pvVar8 = vector<unsigned_long,_true>::operator[](&rhs_layout->offsets,col_idx);
    if (count != 0) {
      vVar5 = *pvVar8;
      local_70 = 0;
      iVar11 = 0;
      do {
        iVar9 = iVar11;
        if (sel->sel_vector != (sel_t *)0x0) {
          iVar9 = (idx_t)sel->sel_vector[iVar11];
        }
        psVar6 = pSVar3->sel_vector;
        iVar10 = iVar9;
        if (psVar6 != (sel_t *)0x0) {
          iVar10 = (idx_t)psVar6[iVar9];
        }
        puVar7 = (lhs_format->unified).validity.super_TemplatedValidityMask<unsigned_long>.
                 validity_mask;
        if (puVar7 == (unsigned_long *)0x0) {
          bVar12 = false;
        }
        else {
          bVar12 = (puVar7[iVar10 >> 6] >> (iVar10 & 0x3f) & 1) == 0;
        }
        puVar1 = (undefined8 *)(*(long *)(pdVar2 + iVar9 * 8) + vVar5);
        local_40._0_8_ = *puVar1;
        local_40.pointer.ptr = (char *)puVar1[1];
        if (((!bVar12) &&
            (((uint)*(byte *)(*(long *)(pdVar2 + iVar9 * 8) + (col_idx >> 3)) &
             1 << ((byte)col_idx & 7)) != 0)) &&
           (bVar12 = string_t::StringComparisonOperators::GreaterThan
                               ((string_t *)&local_40.pointer,(string_t *)(pdVar4 + iVar10 * 0x10)),
           bVar12)) {
          sel->sel_vector[local_70] = (sel_t)iVar9;
          local_70 = local_70 + 1;
        }
        iVar11 = iVar11 + 1;
      } while (count != iVar11);
      return local_70;
    }
  }
  return 0;
}

Assistant:

static idx_t TemplatedMatch(Vector &, const TupleDataVectorFormat &lhs_format, SelectionVector &sel, const idx_t count,
                            const TupleDataLayout &rhs_layout, Vector &rhs_row_locations, const idx_t col_idx,
                            const vector<MatchFunction> &, SelectionVector *no_match_sel, idx_t &no_match_count) {
	if (lhs_format.unified.validity.AllValid()) {
		return TemplatedMatchLoop<NO_MATCH_SEL, T, OP, true>(lhs_format, sel, count, rhs_layout, rhs_row_locations,
		                                                     col_idx, no_match_sel, no_match_count);
	} else {
		return TemplatedMatchLoop<NO_MATCH_SEL, T, OP, false>(lhs_format, sel, count, rhs_layout, rhs_row_locations,
		                                                      col_idx, no_match_sel, no_match_count);
	}
}